

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseModuleField(WastParser *this,Module *module)

{
  TokenType TVar1;
  Module *module_local;
  WastParser *this_local;
  
  TVar1 = Peek(this,1);
  if (TVar1 == Data) {
    this_local._4_4_ = ParseDataModuleField(this,module);
  }
  else if (TVar1 == Elem) {
    this_local._4_4_ = ParseElemModuleField(this,module);
  }
  else if (TVar1 == Tag) {
    this_local._4_4_ = ParseTagModuleField(this,module);
  }
  else if (TVar1 == Export) {
    this_local._4_4_ = ParseExportModuleField(this,module);
  }
  else if (TVar1 == Global) {
    this_local._4_4_ = ParseGlobalModuleField(this,module);
  }
  else if (TVar1 == Import) {
    this_local._4_4_ = ParseImportModuleField(this,module);
  }
  else if (TVar1 == Memory) {
    this_local._4_4_ = ParseMemoryModuleField(this,module);
  }
  else if (TVar1 == Start) {
    this_local._4_4_ = ParseStartModuleField(this,module);
  }
  else if (TVar1 == Table) {
    this_local._4_4_ = ParseTableModuleField(this,module);
  }
  else if (TVar1 == Type) {
    this_local._4_4_ = ParseTypeModuleField(this,module);
  }
  else {
    if (TVar1 != First_RefKind) {
      __assert_fail("!\"ParseModuleField should only be called if IsModuleField() is true\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/wast-parser.cc"
                    ,0x4db,"Result wabt::WastParser::ParseModuleField(Module *)");
    }
    this_local._4_4_ = ParseFuncModuleField(this,module);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseModuleField(Module* module) {
  WABT_TRACE(ParseModuleField);
  switch (Peek(1)) {
    case TokenType::Data:   return ParseDataModuleField(module);
    case TokenType::Elem:   return ParseElemModuleField(module);
    case TokenType::Tag:    return ParseTagModuleField(module);
    case TokenType::Export: return ParseExportModuleField(module);
    case TokenType::Func:   return ParseFuncModuleField(module);
    case TokenType::Type:   return ParseTypeModuleField(module);
    case TokenType::Global: return ParseGlobalModuleField(module);
    case TokenType::Import: return ParseImportModuleField(module);
    case TokenType::Memory: return ParseMemoryModuleField(module);
    case TokenType::Start:  return ParseStartModuleField(module);
    case TokenType::Table:  return ParseTableModuleField(module);
    default:
      assert(
          !"ParseModuleField should only be called if IsModuleField() is true");
      return Result::Error;
  }
}